

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O1

vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> * __thiscall
pbrt::HaltonSampler::Clone
          (vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> *__return_storage_ptr__
          ,HaltonSampler *this,int n,Allocator alloc)

{
  undefined8 *puVar1;
  Tuple2<pbrt::Point2,_int> *pTVar2;
  undefined8 uVar3;
  vector<pbrt::DigitPermutation,_pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>_> *pvVar4;
  Tuple2<pbrt::Point2,_int> TVar5;
  Tuple2<pbrt::Point2,_int> TVar6;
  int iVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  int iVar10;
  undefined4 uVar11;
  int iVar12;
  undefined4 extraout_var;
  pointer pSVar14;
  long lVar15;
  allocator_type local_29;
  long lVar13;
  
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::vector
            (__return_storage_ptr__,(long)n,&local_29);
  if (n == 0) {
    lVar13 = 0;
  }
  else {
    iVar12 = (*(alloc.memoryResource)->_vptr_memory_resource[2])
                       (alloc.memoryResource,(long)n * 0x38,8);
    lVar13 = CONCAT44(extraout_var,iVar12);
  }
  if (0 < n) {
    pSVar14 = (__return_storage_ptr__->
              super__Vector_base<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>)._M_impl
              .super__Vector_impl_data._M_start;
    lVar15 = 0;
    do {
      uVar3 = *(undefined8 *)this;
      pvVar4 = this->digitPermutations;
      TVar5 = (this->baseScales).super_Tuple2<pbrt::Point2,_int>;
      TVar6 = (this->baseExponents).super_Tuple2<pbrt::Point2,_int>;
      iVar12 = this->multInverse[0];
      iVar7 = this->multInverse[1];
      uVar8 = *(undefined4 *)&this->haltonIndex;
      uVar9 = *(undefined4 *)((long)&this->haltonIndex + 4);
      iVar10 = this->dimension;
      uVar11 = *(undefined4 *)&this->field_0x34;
      pTVar2 = (Tuple2<pbrt::Point2,_int> *)(lVar13 + 0x18 + lVar15);
      *pTVar2 = (this->baseExponents).super_Tuple2<pbrt::Point2,_int>;
      pTVar2[1].x = iVar12;
      pTVar2[1].y = iVar7;
      pTVar2[2].x = uVar8;
      pTVar2[2].y = uVar9;
      pTVar2[3].x = iVar10;
      pTVar2[3].y = uVar11;
      puVar1 = (undefined8 *)(lVar13 + lVar15);
      *puVar1 = uVar3;
      puVar1[1] = pvVar4;
      *(Tuple2<pbrt::Point2,_int> *)(puVar1 + 2) = TVar5;
      *(Tuple2<pbrt::Point2,_int> *)(puVar1 + 3) = TVar6;
      (pSVar14->
      super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
      ).bits = lVar13 + lVar15 | 0x3000000000000;
      lVar15 = lVar15 + 0x38;
      pSVar14 = pSVar14 + 1;
    } while ((ulong)(uint)n * 0x38 - lVar15 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<SamplerHandle> HaltonSampler::Clone(int n, Allocator alloc) {
    std::vector<SamplerHandle> samplers(n);
    HaltonSampler *samplerMem = (HaltonSampler *)alloc.allocate_object<HaltonSampler>(n);
    for (int i = 0; i < n; ++i) {
        alloc.construct(&samplerMem[i], *this);
        samplers[i] = &samplerMem[i];
    }
    return samplers;
}